

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O0

StepStatus __thiscall
adios2::core::engine::BP5Writer::BeginStep(BP5Writer *this,StepMode mode,float timeoutSeconds)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  void *this_00;
  long in_RDI;
  rep_conflict rVar4;
  Seconds wait;
  TimePoint wait_start;
  value_type *attributePair;
  const_iterator __end3;
  const_iterator __begin3;
  AttrMap *__range3;
  AttrMap *attributes;
  Seconds ts;
  string *in_stack_fffffffffffffd38;
  BP5Writer *in_stack_fffffffffffffd40;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffd48;
  Spinlock *in_stack_fffffffffffffd50;
  string *in_stack_fffffffffffffd58;
  JSONProfiler *in_stack_fffffffffffffd60;
  double in_stack_fffffffffffffd70;
  string *in_stack_fffffffffffffd78;
  JSONProfiler *in_stack_fffffffffffffd80;
  string *in_stack_fffffffffffffd88;
  string *in_stack_fffffffffffffd90;
  undefined1 AlwaysCopy;
  string *in_stack_fffffffffffffd98;
  ChunkV *in_stack_fffffffffffffda0;
  allocator<char> local_1f9;
  BufferV *in_stack_fffffffffffffe08;
  BP5Serializer *in_stack_fffffffffffffe10;
  allocator local_1d1;
  string local_1d0 [32];
  uint64_t in_stack_fffffffffffffe50;
  uint64_t in_stack_fffffffffffffe58;
  BP5Writer *in_stack_fffffffffffffe60;
  duration<double,_std::ratio<1L,_1L>_> local_178;
  string local_170 [39];
  allocator local_149;
  string local_148 [32];
  duration local_128;
  reference local_120;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
  local_118;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
  local_110;
  pointer local_108;
  pointer local_100;
  rep_conflict local_f8;
  duration local_f0;
  pointer local_e8;
  pointer local_e0;
  duration local_d8;
  rep_conflict local_d0;
  AttributeBase *in_stack_ffffffffffffff38;
  BP5Serializer *in_stack_ffffffffffffff40;
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [48];
  
  if ((*(byte *)(in_RDI + 0x84) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"Engine",&local_31);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"BP5Writer",&local_69);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"BeginStep",&local_91);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_b8,"BeginStep() is called a second time without an intervening EndStep()",
               (allocator *)&stack0xffffffffffffff47);
    helper::Throw<std::logic_error>
              ((string *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
               (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff47);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  local_d8.__r = (rep_conflict)Now();
  local_d0 = (rep_conflict)
             std::chrono::operator-
                       (in_stack_fffffffffffffd48,
                        (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
                         *)in_stack_fffffffffffffd40);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<double,std::ratio<1l,1000000000l>,void>
            ((duration<double,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffd50,
             &in_stack_fffffffffffffd48->__d);
  *(undefined1 *)(in_RDI + 0x84) = 1;
  if ((*(byte *)(in_RDI + 0x7c8) & 1) == 0) {
    local_f0.__r = (rep_conflict)Now();
    local_e8 = (pointer)std::chrono::operator-
                                  (in_stack_fffffffffffffd48,
                                   (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
                                    *)in_stack_fffffffffffffd40);
    std::chrono::duration<double,std::ratio<1l,1l>>::
    duration<double,std::ratio<1l,1000000000l>,void>
              ((duration<double,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffd50,
               &in_stack_fffffffffffffd48->__d);
    *(pointer *)(in_RDI + 0xcd8) = local_e0;
    std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
              ((duration<double,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffd40,
               (duration<double,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffd38);
    local_f8 = (rep_conflict)
               std::chrono::operator/
                         ((duration<double,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffd48,
                          (long *)in_stack_fffffffffffffd40);
    *(rep_conflict *)(in_RDI + 0xce8) = local_f8;
    *(undefined8 *)(in_RDI + 0xcf0) = *(undefined8 *)(in_RDI + 0xcd8);
    bVar1 = std::chrono::operator>
                      ((duration<double,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffd40,
                       (duration<double,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffd38);
    if (bVar1) {
      *(undefined8 *)(in_RDI + 0xcf0) = *(undefined8 *)(in_RDI + 0xce8);
    }
  }
  AlwaysCopy = (undefined1)((ulong)in_stack_fffffffffffffd90 >> 0x38);
  if (((*(byte *)(in_RDI + 0x7c8) & 1) != 0) && ((*(byte *)(in_RDI + 0x21c) & 1) != 0)) {
    local_108 = (pointer)IO::GetAttributes_abi_cxx11_(*(IO **)(in_RDI + 0x28));
    local_100 = local_108;
    local_110._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
         ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                  *)in_stack_fffffffffffffd38);
    local_118._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
         ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
                *)in_stack_fffffffffffffd38);
    while( true ) {
      bVar1 = std::__detail::operator!=(&local_110,&local_118);
      AlwaysCopy = (undefined1)((ulong)in_stack_fffffffffffffd90 >> 0x38);
      if (!bVar1) break;
      local_120 = std::__detail::
                  _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                  ::operator*((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                               *)0xa8186f);
      std::
      unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>::
      operator*((unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
                 *)in_stack_fffffffffffffd40);
      adios2::format::BP5Serializer::OnetimeMarshalAttribute
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      std::__detail::
      _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
      ::operator++((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                    *)in_stack_fffffffffffffd40);
    }
    *(undefined1 *)(in_RDI + 0xc40) = 0;
  }
  *(undefined1 *)(in_RDI + 0x7c8) = 0;
  if (*(int *)(in_RDI + 0x1bc) != 0) {
    shm::Spinlock::lock(in_stack_fffffffffffffd50);
    *(undefined1 *)(in_RDI + 0xd10) = 1;
    shm::Spinlock::unlock(in_stack_fffffffffffffd50);
    local_128.__r = (rep_conflict)Now();
    bVar1 = std::__basic_future<int>::valid((__basic_future<int> *)0xa8193c);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_148,"BS_WaitOnAsync",&local_149);
      profiling::JSONProfiler::Start(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
      std::__cxx11::string::~string(local_148);
      std::allocator<char>::~allocator((allocator<char> *)&local_149);
      std::future<int>::get((future<int> *)in_stack_fffffffffffffd60);
      in_stack_fffffffffffffd98 = (string *)(in_RDI + 0x58);
      in_stack_fffffffffffffda0 = (ChunkV *)local_170;
      std::__cxx11::string::string((string *)in_stack_fffffffffffffda0);
      helper::Comm::Barrier((Comm *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
      std::__cxx11::string::~string(local_170);
      AsyncWriteDataCleanup(in_stack_fffffffffffffd40);
      Now();
      std::chrono::operator-
                (in_stack_fffffffffffffd48,
                 (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
                  *)in_stack_fffffffffffffd40);
      std::chrono::duration<double,std::ratio<1l,1l>>::
      duration<double,std::ratio<1l,1000000000l>,void>
                ((duration<double,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffd50,
                 &in_stack_fffffffffffffd48->__d);
      iVar2 = helper::Comm::Rank((Comm *)0xa81a67);
      if ((iVar2 == 0) &&
         (WriteMetadataFileIndex
                    (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50),
         0 < *(int *)(in_RDI + 0x194))) {
        in_stack_fffffffffffffd80 =
             (JSONProfiler *)
             std::operator<<((ostream *)&std::cout,"BeginStep, wait on async write was = ");
        rVar4 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_178);
        poVar3 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffd80,rVar4);
        in_stack_fffffffffffffd88 = (string *)std::operator<<(poVar3," time since EndStep was = ");
        rVar4 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count
                          ((duration<double,_std::ratio<1L,_1L>_> *)(in_RDI + 0xcd8));
        poVar3 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffd88,rVar4);
        poVar3 = std::operator<<(poVar3," expect next one to be = ");
        rVar4 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count
                          ((duration<double,_std::ratio<1L,_1L>_> *)(in_RDI + 0xcf0));
        this_00 = (void *)std::ostream::operator<<(poVar3,rVar4);
        AlwaysCopy = (undefined1)((ulong)poVar3 >> 0x38);
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      }
      in_stack_fffffffffffffd70 = (double)(in_RDI + 0xb80);
      in_stack_fffffffffffffd78 = (string *)&stack0xfffffffffffffe57;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xfffffffffffffe58,"BS_WaitOnAsync",
                 (allocator *)in_stack_fffffffffffffd78);
      profiling::JSONProfiler::Stop(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe58);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe57);
    }
  }
  if (*(int *)(in_RDI + 0x1e8) == 0) {
    operator_new(0xa0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d0,"BP5Writer",&local_1d1);
    adios2::format::MallocV::MallocV
              ((MallocV *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,(bool)AlwaysCopy,
               (size_t)in_stack_fffffffffffffd88,(size_t)in_stack_fffffffffffffd80,
               (size_t)in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
    adios2::format::BP5Serializer::InitStep(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    std::__cxx11::string::~string(local_1d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  }
  else {
    in_stack_fffffffffffffd40 = (BP5Writer *)(in_RDI + 0x290);
    in_stack_fffffffffffffd48 =
         (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
          *)operator_new(0xb0);
    in_stack_fffffffffffffd50 = (Spinlock *)&local_1f9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffe08,"BP5Writer",(allocator *)in_stack_fffffffffffffd50
              );
    adios2::format::ChunkV::ChunkV
              (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,(bool)AlwaysCopy,
               (size_t)in_stack_fffffffffffffd88,(size_t)in_stack_fffffffffffffd80,
               (size_t)in_stack_fffffffffffffd78);
    adios2::format::BP5Serializer::InitStep(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe08);
    std::allocator<char>::~allocator(&local_1f9);
  }
  *(undefined8 *)(in_RDI + 0xc20) = 0;
  Now();
  std::chrono::operator-
            (in_stack_fffffffffffffd48,
             (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
              *)in_stack_fffffffffffffd40);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<double,std::ratio<1l,1000000000l>,void>
            ((duration<double,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffd50,
             &in_stack_fffffffffffffd48->__d);
  return OK;
}

Assistant:

StepStatus BP5Writer::BeginStep(StepMode mode, const float timeoutSeconds)
{
    if (m_BetweenStepPairs)
    {
        helper::Throw<std::logic_error>("Engine", "BP5Writer", "BeginStep",
                                        "BeginStep() is called a second time "
                                        "without an intervening EndStep()");
    }

    Seconds ts = Now() - m_EngineStart;
    // std::cout << "BEGIN STEP starts at: " << ts.count() << std::endl;
    m_BetweenStepPairs = true;

    if (!m_IsFirstStep)
    {
        m_LastTimeBetweenSteps = Now() - m_EndStepEnd;
        m_TotalTimeBetweenSteps += m_LastTimeBetweenSteps;
        m_AvgTimeBetweenSteps = m_TotalTimeBetweenSteps / m_WriterStep;
        m_ExpectedTimeBetweenSteps = m_LastTimeBetweenSteps;
        if (m_ExpectedTimeBetweenSteps > m_AvgTimeBetweenSteps)
        {
            m_ExpectedTimeBetweenSteps = m_AvgTimeBetweenSteps;
        }
    }

    if (m_IsFirstStep && m_Parameters.UseOneTimeAttributes)
    {
        const auto &attributes = m_IO.GetAttributes();

        for (const auto &attributePair : attributes)
        {
            m_BP5Serializer.OnetimeMarshalAttribute(*(attributePair.second));
        }
        m_MarshalAttributesNecessary = false;
    }

    // one-time stuff after Open must be done above
    m_IsFirstStep = false;

    if (m_Parameters.AsyncWrite)
    {
        m_AsyncWriteLock.lock();
        m_flagRush = true;
        m_AsyncWriteLock.unlock();
        TimePoint wait_start = Now();
        if (m_WriteFuture.valid())
        {
            m_Profiler.Start("BS_WaitOnAsync");
            m_WriteFuture.get();
            m_Comm.Barrier();
            AsyncWriteDataCleanup();
            Seconds wait = Now() - wait_start;
            if (m_Comm.Rank() == 0)
            {
                WriteMetadataFileIndex(m_LatestMetaDataPos, m_LatestMetaDataSize);
                if (m_Parameters.verbose > 0)
                {
                    std::cout << "BeginStep, wait on async write was = " << wait.count()
                              << " time since EndStep was = " << m_LastTimeBetweenSteps.count()
                              << " expect next one to be = " << m_ExpectedTimeBetweenSteps.count()
                              << std::endl;
                }
            }
            m_Profiler.Stop("BS_WaitOnAsync");
        }
    }

    if (m_Parameters.BufferVType == (int)BufferVType::MallocVType)
    {
        m_BP5Serializer.InitStep(new MallocV(
            "BP5Writer", false, m_BP5Serializer.m_BufferAlign, m_BP5Serializer.m_BufferBlockSize,
            m_Parameters.InitialBufferSize, m_Parameters.GrowthFactor));
    }
    else
    {
        m_BP5Serializer.InitStep(new ChunkV("BP5Writer", false, m_BP5Serializer.m_BufferAlign,
                                            m_BP5Serializer.m_BufferBlockSize,
                                            m_Parameters.BufferChunkSize));
    }
    m_ThisTimestepDataSize = 0;

    ts = Now() - m_EngineStart;
    // std::cout << "BEGIN STEP ended at: " << ts.count() << std::endl;
    return StepStatus::OK;
}